

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint file_index)

{
  mz_zip_internal_state *pmVar1;
  mz_bool mVar2;
  int iVar3;
  long lVar4;
  size_t sVar5;
  int *piVar6;
  ulong uVar7;
  uint in_EDX;
  long in_RSI;
  mz_zip_archive *in_RDI;
  bool bVar8;
  mz_uint8 *pSrc_central_header;
  void *pBuf;
  mz_zip_internal_state *pState;
  size_t orig_central_dir_size;
  mz_uint8 central_header [46];
  mz_uint8 *pLocal_header;
  mz_uint32 local_header_u32 [8];
  mz_uint64 cur_dst_file_ofs;
  mz_uint64 cur_src_file_ofs;
  mz_uint64 local_dir_header_ofs;
  mz_uint64 comp_bytes_remaining;
  mz_uint num_alignment_padding_bytes;
  mz_uint bit_flags;
  mz_uint n;
  size_t orig_size_2;
  size_t orig_size_1;
  size_t orig_size;
  mz_uint32 in_stack_00000dec;
  mz_uint64 in_stack_00000df0;
  mz_zip_archive *in_stack_00000df8;
  ulong local_238;
  ulong local_230;
  size_t local_228;
  ulong uVar9;
  mz_uint growing;
  mz_alloc_func min_new_capacity;
  mz_zip_array *pArray;
  mz_zip_archive *pZip_00;
  undefined1 local_1e8 [42];
  mz_uint8 amStack_1be [14];
  int *local_1b0;
  int local_1a8 [8];
  mz_uint64 local_188;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  mz_uint local_168;
  uint local_164;
  uint local_160 [2];
  long local_158;
  mz_zip_archive *local_150;
  mz_bool local_148;
  mz_zip_archive *local_138;
  size_t local_130;
  long local_128;
  uint *local_120;
  mz_zip_array *local_118;
  mz_zip_archive *local_110;
  uint local_104;
  size_t local_100;
  ulong local_f8;
  void *local_f0;
  mz_zip_internal_state *local_e8;
  mz_zip_archive *local_e0;
  uint local_d4;
  size_t local_d0;
  long local_c8;
  undefined1 *local_c0;
  mz_zip_internal_state *local_b8;
  mz_zip_archive *local_b0;
  uint local_a8;
  undefined4 local_a4;
  ulong local_a0;
  mz_zip_internal_state *local_98;
  mz_zip_archive *local_90;
  int local_88;
  undefined4 local_84;
  ulong local_80;
  mz_zip_internal_state *local_78;
  mz_zip_archive *local_70;
  int local_68;
  undefined4 local_64;
  ulong local_60;
  mz_zip_array *local_58;
  mz_zip_archive *local_50;
  int local_48;
  undefined4 local_44;
  ulong local_40;
  mz_zip_internal_state *local_38;
  mz_zip_archive *local_30;
  undefined4 local_24;
  ulong local_20;
  mz_zip_internal_state *local_18;
  mz_zip_archive *local_10;
  
  local_1b0 = local_1a8;
  if (((in_RDI == (mz_zip_archive *)0x0) || (in_RDI->m_pState == (mz_zip_internal_state *)0x0)) ||
     (in_RDI->m_zip_mode != MZ_ZIP_MODE_WRITING)) {
    local_148 = 0;
  }
  else {
    if (((in_RSI == 0) || (*(long *)(in_RSI + 0x58) == 0)) ||
       ((*(uint *)(in_RSI + 0x10) <= in_EDX || (*(int *)(in_RSI + 0x14) != 1)))) {
      local_138 = (mz_zip_archive *)0x0;
    }
    else {
      local_138 = (mz_zip_archive *)
                  (**(long **)(in_RSI + 0x58) +
                  (ulong)*(uint *)(*(long *)(*(long *)(in_RSI + 0x58) + 0x20) + (ulong)in_EDX * 4));
    }
    if (local_138 == (mz_zip_archive *)0x0) {
      local_148 = 0;
    }
    else {
      pmVar1 = in_RDI->m_pState;
      pZip_00 = local_138;
      local_158 = in_RSI;
      local_150 = in_RDI;
      local_168 = (anonymous_namespace)::miniz::
                  mz_zip_writer_compute_padding_needed_for_file_alignment(in_RDI);
      if ((local_150->m_total_files == 0xffff) ||
         (0xffffffff < local_150->m_archive_size + (ulong)local_168 + 0x4c)) {
        local_148 = 0;
      }
      else {
        local_180 = (ulong)*(uint *)((long)&pZip_00->m_pFree + 2);
        local_188 = local_150->m_archive_size;
        lVar4 = (**(code **)(local_158 + 0x40))
                          (*(undefined8 *)(local_158 + 0x50),local_180,local_1b0,0x1e);
        if (lVar4 == 0x1e) {
          if (*local_1b0 == 0x4034b50) {
            local_180 = local_180 + 0x1e;
            mVar2 = (anonymous_namespace)::miniz::mz_zip_writer_write_zeros
                              (in_stack_00000df8,in_stack_00000df0,in_stack_00000dec);
            if (mVar2 == 0) {
              local_148 = 0;
            }
            else {
              local_188 = local_168 + local_188;
              local_178 = local_188;
              if ((local_150->m_file_offset_alignment != 0) &&
                 ((local_188 & local_150->m_file_offset_alignment - 1) != 0)) {
                __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                              ,0x191b,
                              "mz_bool (anonymous namespace)::miniz::mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                             );
              }
              sVar5 = (*local_150->m_pWrite)(local_150->m_pIO_opaque,local_188,local_1b0,0x1e);
              if (sVar5 == 0x1e) {
                local_188 = local_188 + 0x1e;
                local_160[0] = (uint)*(ushort *)((long)local_1b0 + 0x1a) +
                               (uint)*(ushort *)(local_1b0 + 7);
                local_170 = (ulong)(local_160[0] + pZip_00->m_zip_mode);
                min_new_capacity = local_150->m_pAlloc;
                pArray = (mz_zip_array *)local_150->m_pAlloc_opaque;
                uVar9 = local_170;
                if (0x10000 < local_170) {
                  uVar9 = 0x10000;
                }
                if (uVar9 < 0x10) {
                  local_228 = 0x10;
                }
                else {
                  local_230 = local_170;
                  if (0x10000 < local_170) {
                    local_230 = 0x10000;
                  }
                  local_228 = local_230;
                }
                piVar6 = (int *)(*min_new_capacity)(pArray,1,local_228);
                if (piVar6 == (int *)0x0) {
                  local_148 = 0;
                }
                else {
                  for (; growing = (mz_uint)(uVar9 >> 0x20), local_170 != 0;
                      local_170 = local_170 - local_160[0]) {
                    if (local_170 < 0x10001) {
                      local_238 = local_170;
                    }
                    else {
                      local_238 = 0x10000;
                    }
                    local_160[0] = (uint)local_238;
                    uVar7 = (**(code **)(local_158 + 0x40))
                                      (*(undefined8 *)(local_158 + 0x50),local_180,piVar6,
                                       local_238 & 0xffffffff);
                    if (uVar7 != local_160[0]) {
                      (*local_150->m_pFree)(local_150->m_pAlloc_opaque,piVar6);
                      return 0;
                    }
                    local_180 = local_160[0] + local_180;
                    sVar5 = (*local_150->m_pWrite)
                                      (local_150->m_pIO_opaque,local_188,piVar6,(size_t)local_160[0]
                                      );
                    if (sVar5 != local_160[0]) {
                      (*local_150->m_pFree)(local_150->m_pAlloc_opaque,piVar6);
                      return 0;
                    }
                    local_188 = local_160[0] + local_188;
                  }
                  local_164 = (uint)*(ushort *)((long)local_1b0 + 6);
                  if ((*(ushort *)((long)local_1b0 + 6) & 8) != 0) {
                    lVar4 = (**(code **)(local_158 + 0x40))
                                      (*(undefined8 *)(local_158 + 0x50),local_180,piVar6,0x10);
                    if (lVar4 != 0x10) {
                      (*local_150->m_pFree)(local_150->m_pAlloc_opaque,piVar6);
                      return 0;
                    }
                    iVar3 = 3;
                    if (*piVar6 == 0x8074b50) {
                      iVar3 = 4;
                    }
                    local_160[0] = iVar3 << 2;
                    sVar5 = (*local_150->m_pWrite)
                                      (local_150->m_pIO_opaque,local_188,piVar6,(size_t)local_160[0]
                                      );
                    if (sVar5 != local_160[0]) {
                      (*local_150->m_pFree)(local_150->m_pAlloc_opaque,piVar6);
                      return 0;
                    }
                    local_180 = local_160[0] + local_180;
                    local_188 = local_160[0] + local_188;
                  }
                  (*local_150->m_pFree)(local_150->m_pAlloc_opaque,piVar6);
                  if (local_188 < 0x100000000) {
                    uVar9 = (pmVar1->m_central_dir).m_size;
                    memcpy(local_1e8,pZip_00,0x2e);
                    (anonymous_namespace)::miniz::mz_write_le32(amStack_1be,(mz_uint32)local_178);
                    local_c0 = local_1e8;
                    local_b0 = local_150;
                    local_c8 = 0x2e;
                    local_d0 = (pmVar1->m_central_dir).m_size;
                    local_a0 = local_d0 + 0x2e;
                    local_90 = local_150;
                    local_a4 = 1;
                    local_b8 = pmVar1;
                    local_98 = pmVar1;
                    if (((pmVar1->m_central_dir).m_capacity < local_a0) &&
                       (mVar2 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                                          (pZip_00,pArray,(size_t)min_new_capacity,growing),
                       mVar2 == 0)) {
                      local_88 = 0;
                    }
                    else {
                      (local_98->m_central_dir).m_size = local_a0;
                      local_88 = 1;
                    }
                    bVar8 = local_88 != 0;
                    if (bVar8) {
                      memcpy((void *)((long)(local_b8->m_central_dir).m_p +
                                     local_d0 * (local_b8->m_central_dir).m_element_size),local_c0,
                             local_c8 * (ulong)(local_b8->m_central_dir).m_element_size);
                    }
                    local_a8 = (uint)bVar8;
                    if (local_a8 == 0) {
                      local_148 = 0;
                    }
                    else {
                      local_160[0] = (uint)*(ushort *)&pZip_00->field_0x1c +
                                     (uint)*(ushort *)&pZip_00->field_0x1e +
                                     (uint)*(ushort *)&pZip_00->m_pAlloc;
                      local_f0 = (void *)((long)&pZip_00->m_pFree + 6);
                      local_f8 = (ulong)local_160[0];
                      local_e0 = local_150;
                      local_100 = (pmVar1->m_central_dir).m_size;
                      local_80 = local_100 + local_f8;
                      local_70 = local_150;
                      local_84 = 1;
                      local_e8 = pmVar1;
                      local_78 = pmVar1;
                      if (((pmVar1->m_central_dir).m_capacity < local_80) &&
                         (mVar2 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                                            (pZip_00,pArray,(size_t)min_new_capacity,growing),
                         mVar2 == 0)) {
                        local_68 = 0;
                      }
                      else {
                        (local_78->m_central_dir).m_size = local_80;
                        local_68 = 1;
                      }
                      bVar8 = local_68 != 0;
                      if (bVar8) {
                        memcpy((void *)((long)(local_e8->m_central_dir).m_p +
                                       local_100 * (local_e8->m_central_dir).m_element_size),
                               local_f0,local_f8 * (local_e8->m_central_dir).m_element_size);
                      }
                      local_d4 = (uint)bVar8;
                      if (local_d4 == 0) {
                        local_10 = local_150;
                        local_24 = 0;
                        local_20 = uVar9;
                        local_18 = pmVar1;
                        if ((uVar9 <= (pmVar1->m_central_dir).m_capacity) ||
                           (mVar2 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                                              (pZip_00,pArray,(size_t)min_new_capacity,growing),
                           mVar2 != 0)) {
                          (local_18->m_central_dir).m_size = local_20;
                        }
                        local_148 = 0;
                      }
                      else if ((pmVar1->m_central_dir).m_size < 0x100000000) {
                        local_160[0] = (uint)uVar9;
                        local_118 = &pmVar1->m_central_dir_offsets;
                        local_110 = local_150;
                        local_120 = local_160;
                        local_128 = 1;
                        local_130 = (pmVar1->m_central_dir_offsets).m_size;
                        local_60 = local_130 + 1;
                        local_50 = local_150;
                        local_64 = 1;
                        local_58 = local_118;
                        if (((pmVar1->m_central_dir_offsets).m_capacity < local_60) &&
                           (mVar2 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                                              (pZip_00,pArray,(size_t)min_new_capacity,growing),
                           mVar2 == 0)) {
                          local_48 = 0;
                        }
                        else {
                          local_58->m_size = local_60;
                          local_48 = 1;
                        }
                        bVar8 = local_48 != 0;
                        if (bVar8) {
                          memcpy((void *)((long)local_118->m_p +
                                         local_130 * local_118->m_element_size),local_120,
                                 local_128 * (ulong)local_118->m_element_size);
                        }
                        local_104 = (uint)bVar8;
                        if (local_104 == 0) {
                          local_30 = local_150;
                          local_44 = 0;
                          local_40 = uVar9;
                          local_38 = pmVar1;
                          if ((uVar9 <= (pmVar1->m_central_dir).m_capacity) ||
                             (mVar2 = (anonymous_namespace)::miniz::mz_zip_array_ensure_capacity
                                                (pZip_00,pArray,(size_t)min_new_capacity,growing),
                             mVar2 != 0)) {
                            (local_38->m_central_dir).m_size = local_40;
                          }
                          local_148 = 0;
                        }
                        else {
                          local_150->m_total_files = local_150->m_total_files + 1;
                          local_150->m_archive_size = local_188;
                          local_148 = 1;
                        }
                      }
                      else {
                        local_148 = 0;
                      }
                    }
                  }
                  else {
                    local_148 = 0;
                  }
                }
              }
              else {
                local_148 = 0;
              }
            }
          }
          else {
            local_148 = 0;
          }
        }
        else {
          local_148 = 0;
        }
      }
    }
  }
  return local_148;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip,
                                          mz_zip_archive *pSource_zip,
                                          mz_uint file_index) {
  mz_uint n, bit_flags, num_alignment_padding_bytes;
  mz_uint64 comp_bytes_remaining, local_dir_header_ofs;
  mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  mz_uint8 central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
  size_t orig_central_dir_size;
  mz_zip_internal_state *pState;
  void *pBuf;
  const mz_uint8 *pSrc_central_header;

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING))
    return MZ_FALSE;
  if (NULL ==
      (pSrc_central_header = mz_zip_reader_get_cdh(pSource_zip, file_index)))
    return MZ_FALSE;
  pState = pZip->m_pState;

  num_alignment_padding_bytes =
      mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) ||
      ((pZip->m_archive_size + num_alignment_padding_bytes +
        MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) >
       0xFFFFFFFF))
    return MZ_FALSE;

  cur_src_file_ofs =
      MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS);
  cur_dst_file_ofs = pZip->m_archive_size;

  if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs,
                           pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;
  cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs,
                                 num_alignment_padding_bytes))
    return MZ_FALSE;
  cur_dst_file_ofs += num_alignment_padding_bytes;
  local_dir_header_ofs = cur_dst_file_ofs;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) ==
              0);
  }

  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header,
                     MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

  n = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  comp_bytes_remaining =
      n + MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);

  if (NULL ==
      (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                             (size_t)MZ_MAX(sizeof(mz_uint32) * 4,
                                            MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE,
                                                   comp_bytes_remaining)))))
    return MZ_FALSE;

  while (comp_bytes_remaining) {
    n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, comp_bytes_remaining);
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_src_file_ofs += n;

    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }
    cur_dst_file_ofs += n;

    comp_bytes_remaining -= n;
  }

  bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
  if (bit_flags & 8) {
    // Copy data descriptor
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf,
                             sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == 0x08074b50) ? 4 : 3);
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n) {
      pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
      return MZ_FALSE;
    }

    cur_src_file_ofs += n;
    cur_dst_file_ofs += n;
  }
  pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

  // no zip64 support yet
  if (cur_dst_file_ofs > 0xFFFFFFFF)
    return MZ_FALSE;

  orig_central_dir_size = pState->m_central_dir.m_size;

  memcpy(central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);
  MZ_WRITE_LE32(central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS,
                local_dir_header_ofs);
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, central_header,
                              MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
    return MZ_FALSE;

  n = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
      MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
  if (!mz_zip_array_push_back(
          pZip, &pState->m_central_dir,
          pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, n)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  if (pState->m_central_dir.m_size > 0xFFFFFFFF)
    return MZ_FALSE;
  n = (mz_uint32)orig_central_dir_size;
  if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1)) {
    mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size,
                        MZ_FALSE);
    return MZ_FALSE;
  }

  pZip->m_total_files++;
  pZip->m_archive_size = cur_dst_file_ofs;

  return MZ_TRUE;
}